

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O0

Query * queryparse::transform(node *n)

{
  bool bVar1;
  size_type sVar2;
  pointer pnVar3;
  Query *this;
  type type;
  type this_00;
  runtime_error *prVar4;
  vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
  *in_RSI;
  Query *in_RDI;
  vector<Query,_std::allocator<Query>_> opts_1;
  vector<Query,_std::allocator<Query>_> opts;
  value_type *expr;
  vector<Query,_std::allocator<Query>_> subq;
  __normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
  it;
  out_of_range *e;
  uint32_t counti;
  value_type *count;
  vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
  *in_stack_fffffffffffffd48;
  Query *in_stack_fffffffffffffd50;
  Query *in_stack_fffffffffffffd58;
  vector<QToken,_std::allocator<QToken>_> *in_stack_fffffffffffffd60;
  QString *in_stack_fffffffffffffd68;
  Query *in_stack_fffffffffffffd70;
  default_node_content *in_stack_fffffffffffffd88;
  node *in_stack_fffffffffffffed8;
  __normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
  local_78 [2];
  string local_68 [36];
  int local_44;
  const_reference local_40;
  node *in_stack_ffffffffffffffe8;
  
  bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::plaintext>
                    ((default_node_content *)(in_RSI + 1));
  if (((bVar1) ||
      (bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::wide_plaintext>
                         ((default_node_content *)(in_RSI + 1)), bVar1)) ||
     (bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::hexstring>
                        ((default_node_content *)(in_RSI + 1)), bVar1)) {
    transform_qstring(in_stack_fffffffffffffed8);
    Query::Query(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::vector<QToken,_std::allocator<QToken>_>::~vector(in_stack_fffffffffffffd60);
    return in_RDI;
  }
  bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::min_of_expr>
                    ((default_node_content *)(in_RSI + 1));
  if (bVar1) {
    local_40 = std::
               vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
               ::operator[](in_RSI,0);
    std::
    unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>::
    operator->((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)0x1c0248);
    tao::pegtl::parse_tree::default_node_content::content_abi_cxx11_(in_stack_fffffffffffffd88);
    local_44 = std::__cxx11::stoi((string *)in_stack_fffffffffffffd50,
                                  (size_t *)in_stack_fffffffffffffd48,0);
    std::__cxx11::string::~string(local_68);
    std::
    vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
    ::cbegin(in_stack_fffffffffffffd48);
    local_78[0] = __gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
                  ::operator+((__normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
                               *)in_stack_fffffffffffffd58,
                              (difference_type)in_stack_fffffffffffffd50);
    std::vector<Query,_std::allocator<Query>_>::vector
              ((vector<Query,_std::allocator<Query>_> *)0x1c03b3);
    while( true ) {
      std::
      vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
      ::cend(in_stack_fffffffffffffd48);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
                          *)in_stack_fffffffffffffd50,
                         (__normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
                          *)in_stack_fffffffffffffd48);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
      ::operator*(local_78);
      std::
      unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>::
      operator*((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                 *)in_stack_fffffffffffffd50);
      transform(in_stack_ffffffffffffffe8);
      std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffd60,
                 in_stack_fffffffffffffd58);
      Query::~Query(in_stack_fffffffffffffd50);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
      ::operator++(local_78);
    }
    Query::Query(in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                 (vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffd60);
    std::vector<Query,_std::allocator<Query>_>::~vector
              ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffd60);
    return in_RDI;
  }
  bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::expression>
                    ((default_node_content *)(in_RSI + 1));
  if (bVar1) {
    sVar2 = std::
            vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
            ::size(in_RSI);
    if (sVar2 == 1) {
      std::
      vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
      ::operator[](in_RSI,0);
      std::
      unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>::
      operator*((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                 *)in_stack_fffffffffffffd50);
      transform(in_stack_ffffffffffffffe8);
      return in_RDI;
    }
    std::
    vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
    ::operator[](in_RSI,1);
    pnVar3 = std::
             unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
             ::operator->((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                           *)0x1c0543);
    bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::op_or>
                      (&(pnVar3->super_basic_node<tao::pegtl::parse_tree::node>).
                        super_default_node_content);
    if (!bVar1) {
      pnVar3 = std::
               unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
               ::operator->((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                             *)0x1c06c8);
      bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::op_and>
                        (&(pnVar3->super_basic_node<tao::pegtl::parse_tree::node>).
                          super_default_node_content);
      if (bVar1) {
        std::vector<Query,_std::allocator<Query>_>::vector
                  ((vector<Query,_std::allocator<Query>_> *)0x1c06ea);
        std::
        vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
        ::operator[](in_RSI,0);
        type = std::
               unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
               ::operator*((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                            *)in_stack_fffffffffffffd50);
        transform(in_stack_ffffffffffffffe8);
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                  ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffd60,
                   in_stack_fffffffffffffd58);
        Query::~Query(in_stack_fffffffffffffd50);
        std::
        vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
        ::operator[](in_RSI,2);
        this_00 = std::
                  unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                  ::operator*((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                               *)in_stack_fffffffffffffd50);
        transform(in_stack_ffffffffffffffe8);
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                  ((vector<Query,_std::allocator<Query>_> *)this_00,in_stack_fffffffffffffd58);
        Query::~Query(in_stack_fffffffffffffd50);
        Query::Query(in_stack_fffffffffffffd70,(QueryType *)type,
                     (vector<Query,_std::allocator<Query>_> *)this_00);
        std::vector<Query,_std::allocator<Query>_>::~vector
                  ((vector<Query,_std::allocator<Query>_> *)this_00);
        return in_RDI;
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"encountered unexpected expression");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<Query,_std::allocator<Query>_>::vector
              ((vector<Query,_std::allocator<Query>_> *)0x1c0565);
    std::
    vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
    ::operator[](in_RSI,0);
    std::
    unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>::
    operator*((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
               *)in_stack_fffffffffffffd50);
    transform(in_stack_ffffffffffffffe8);
    std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
              ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd58);
    Query::~Query(in_stack_fffffffffffffd50);
    std::
    vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
    ::operator[](in_RSI,2);
    this = (Query *)std::
                    unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                    ::operator*((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                                 *)in_stack_fffffffffffffd50);
    transform(in_stack_ffffffffffffffe8);
    std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
              ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd58);
    Query::~Query(in_stack_fffffffffffffd50);
    Query::Query(this,(QueryType *)in_stack_fffffffffffffd68,
                 (vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffd60);
    std::vector<Query,_std::allocator<Query>_>::~vector
              ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffd60);
    return in_RDI;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"encountered unexpected node");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Query transform(const parse_tree::node &n) {
    if (n.is<plaintext>() || n.is<wide_plaintext>() || n.is<hexstring>()) {
        return Query(transform_qstring(n));
    }
    if (n.is<min_of_expr>()) {
        auto &count = n.children[0];
        uint32_t counti;

        try {
            counti = std::stoi(count->content());
        } catch (std::out_of_range &e) {
            throw std::runtime_error(
                "number N is out of range in 'min N of (...)' expression");
        }

        auto it = n.children.cbegin() + 1;
        std::vector<Query> subq;
        for (; it != n.children.cend(); ++it) {
            subq.emplace_back(transform(**it));
        }

        return Query(counti, std::move(subq));
    }
    if (n.is<expression>()) {
        if (n.children.size() == 1) {
            return transform(*n.children[0]);
        }

        auto &expr = n.children[1];
        if (expr->is<op_or>()) {
            std::vector<Query> opts;
            opts.emplace_back(transform(*n.children[0]));
            opts.emplace_back(transform(*n.children[2]));
            return Query(QueryType::OR, std::move(opts));
        }
        if (expr->is<op_and>()) {
            std::vector<Query> opts;
            opts.emplace_back(transform(*n.children[0]));
            opts.emplace_back(transform(*n.children[2]));
            return Query(QueryType::AND, std::move(opts));
        }
        throw std::runtime_error("encountered unexpected expression");
    }
    throw std::runtime_error("encountered unexpected node");
}